

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O0

void __thiscall
wasm::Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::walkElementSegment
          (Walker<Replacer,_wasm::Visitor<Replacer,_void>_> *this,ElementSegment *segment)

{
  bool bVar1;
  reference ppEVar2;
  Expression *local_38;
  Expression *expr;
  iterator __end2;
  iterator __begin2;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *__range2;
  ElementSegment *segment_local;
  Walker<Replacer,_wasm::Visitor<Replacer,_void>_> *this_local;
  
  bVar1 = IString::is(&(segment->table).super_IString);
  if (bVar1) {
    walk(this,&segment->offset);
  }
  __end2 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::begin
                     (&segment->data);
  expr = (Expression *)
         std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::end(&segment->data);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                                     *)&expr), bVar1) {
    ppEVar2 = __gnu_cxx::
              __normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
              ::operator*(&__end2);
    local_38 = *ppEVar2;
    walk(this,&local_38);
    __gnu_cxx::
    __normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
    ::operator++(&__end2);
  }
  Visitor<Replacer,_void>::visitElementSegment((Visitor<Replacer,_void> *)this,segment);
  return;
}

Assistant:

void walkElementSegment(ElementSegment* segment) {
    if (segment->table.is()) {
      walk(segment->offset);
    }
    for (auto* expr : segment->data) {
      walk(expr);
    }
    static_cast<SubType*>(this)->visitElementSegment(segment);
  }